

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsCreateTracedExternalObject
          (void *data,size_t inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsValueRef prototype,JsValueRef *object)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  BOOL BVar5;
  JsrtContext *currentContext;
  RecyclableObject *pRVar6;
  JsrtExternalObject *pJVar7;
  undefined4 *puVar8;
  AutoNestedHandledExceptionType local_88 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,false,false);
  if (JVar4 != JsNoError) goto LAB_003c848f;
  pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
           ptr;
  _actionEntryPopper.m_resultPtr = (TTDVar *)pSVar1;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_88,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (pSVar1->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTAllocateExternalObject
              (*(EventLog **)((long)_actionEntryPopper.m_resultPtr[0x77] + 0x16b8),
               (TTDJsRTActionResultAutoRecorder *)auStack_48,prototype);
  }
  if (object == (JsValueRef *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    if (prototype == (JsValueRef)0x0) {
      pRVar6 = (RecyclableObject *)0x0;
    }
    else {
      BVar5 = Js::JavascriptOperators::IsObjectOrNull(prototype);
      if (BVar5 == 0) {
        JVar4 = JsErrorArgumentNotObject;
        goto LAB_003c8413;
      }
      pRVar6 = Js::VarTo<Js::RecyclableObject>(prototype);
      pSVar1 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != (ScriptContext *)_actionEntryPopper.m_resultPtr) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != (ThreadContext *)_actionEntryPopper.m_resultPtr[0x77])
        goto LAB_003c8413;
        prototype = Js::CrossSite::MarshalVar
                              ((ScriptContext *)_actionEntryPopper.m_resultPtr,pRVar6,false);
      }
      pRVar6 = Js::VarTo<Js::RecyclableObject>(prototype);
    }
    JVar4 = JsErrorInvalidArgument;
    if (inlineSlotSize >> 0x20 == 0) {
      pJVar7 = JsrtExternalObject::Create
                         (data,(uint)inlineSlotSize,traceCallback,finalizeCallback,pRVar6,
                          (ScriptContext *)_actionEntryPopper.m_resultPtr,(JsrtExternalType *)0x0);
      *object = pJVar7;
      JVar4 = JsNoError;
      if (*(char *)((long)_actionEntryPopper.m_resultPtr + 0x143d) == '\x01') {
        if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(JsrtExternalObject **)_actionEntryPopper.m_actionEvent = pJVar7;
      }
    }
  }
LAB_003c8413:
  if (((JVar4 - JsErrorNoCurrentContext < 7) &&
      ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0x11f,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_88);
LAB_003c848f:
  if (auStack_48 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_48 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_48 + 4) = JVar4;
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsCreateTracedExternalObject(
    _In_opt_ void *data,
    _In_opt_ size_t inlineSlotSize,
    _In_opt_ JsTraceCallback traceCallback,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef *object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT_OR_NULL(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }
        if (inlineSlotSize > UINT32_MAX)
        {
            return JsErrorInvalidArgument;
        }
        *object = JsrtExternalObject::Create(data, (uint)inlineSlotSize, traceCallback, finalizeCallback, prototypeObject, scriptContext, nullptr);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}